

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  path *element;
  format fVar8;
  undefined1 *puVar10;
  bool bVar11;
  bool bVar12;
  path *result;
  iterator __begin2;
  iterator __end2;
  const_iterator a;
  const_iterator b;
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [32];
  const_iterator local_2b8;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  char local_2a0 [24];
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  const_iterator local_270;
  _Alloc_hider local_268;
  size_type local_260;
  char local_258 [16];
  undefined1 local_248 [40];
  path local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  path local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  const_iterator local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  char *local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  path local_170;
  iterator local_150;
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  pointer pcVar9;
  
  root_name((path *)local_2d8,this);
  root_name((path *)&local_150,base);
  iVar4 = compare((path *)local_2d8,(path *)&local_150);
  if (iVar4 == 0) {
    sVar7 = root_name_length(this);
    if (sVar7 < (this->_path)._M_string_length) {
      bVar11 = (this->_path)._M_dataplus._M_p[sVar7] == '/';
    }
    else {
      bVar11 = false;
    }
    sVar7 = root_name_length(base);
    if (sVar7 < (base->_path)._M_string_length) {
      bVar12 = (base->_path)._M_dataplus._M_p[sVar7] == '/';
    }
    else {
      bVar12 = false;
    }
    if (bVar11 == bVar12) {
      sVar7 = root_name_length(this);
      if ((sVar7 < (this->_path)._M_string_length) && ((this->_path)._M_dataplus._M_p[sVar7] == '/')
         ) {
        if ((const_iterator *)local_150._first._M_current != &local_150._prefix) {
          operator_delete(local_150._first._M_current);
        }
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_);
        }
LAB_001ade1d:
        local_2d8._0_8_ = (this->_path)._M_dataplus._M_p;
        iterator::iterator(&local_150,this,(const_iterator *)local_2d8);
        local_2d8._0_8_ = (base->_path)._M_dataplus._M_p;
        iterator::iterator(&local_108,base,(const_iterator *)local_2d8);
        do {
          local_c0._first._M_current =
               (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
          iterator::iterator((iterator *)local_2d8,this,&local_c0._first);
          cVar3._M_current = local_150._iter._M_current;
          cVar2._M_current = local_2b8._M_current;
          if (local_150._iter._M_current == local_2b8._M_current) {
LAB_001adee0:
            bVar11 = false;
          }
          else {
            local_c0._first._M_current =
                 (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
            iterator::iterator(&local_78,base,&local_c0._first);
            if (local_108._iter._M_current == local_78._iter._M_current) goto LAB_001adee0;
            iVar4 = compare(&local_150._current,&local_108._current);
            bVar11 = iVar4 == 0;
          }
          if ((cVar3._M_current != cVar2._M_current) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2)) {
            operator_delete(local_78._current._path._M_dataplus._M_p);
          }
          if (local_2b0._M_p != local_2a0) {
            operator_delete(local_2b0._M_p);
          }
          if (!bVar11) {
            local_c0._first._M_current =
                 (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
            iterator::iterator((iterator *)local_2d8,this,&local_c0._first);
            if (local_150._iter._M_current == local_2b8._M_current) {
              local_248._0_8_ = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
              iterator::iterator(&local_c0,base,(const_iterator *)local_248);
              bVar11 = local_108._iter._M_current == local_c0._iter._M_current;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._current._path._M_dataplus._M_p != &local_c0._current._path.field_2) {
                operator_delete(local_c0._current._path._M_dataplus._M_p);
              }
            }
            else {
              bVar11 = false;
            }
            if (local_2b0._M_p != local_2a0) {
              operator_delete(local_2b0._M_p);
            }
            if (bVar11) {
              local_2d8._0_8_ = local_2d8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,".","");
              (__return_storage_ptr__->_path)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->_path).field_2;
              pcVar9 = (pointer)local_2d8._0_8_;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)__return_storage_ptr__,local_2d8._0_8_,
                         (pointer)(local_2d8._0_8_ + CONCAT44(local_2d8._12_4_,local_2d8._8_4_)));
              fVar8 = (format)pcVar9;
              if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                operator_delete((void *)local_2d8._0_8_);
              }
              postprocess_path_with_format(__return_storage_ptr__,fVar8);
            }
            else {
              local_1b8._M_current = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length
              ;
              iterator::iterator((iterator *)local_248,base,&local_1b8);
              input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                        ((input_iterator_range<ghc::filesystem::path::iterator> *)local_2d8,
                         &local_108,(iterator *)local_248);
              paVar1 = &local_220._path.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._path._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._path._M_dataplus._M_p);
              }
              local_248._32_8_ = local_2b8._M_current;
              local_248._16_4_ = local_2d8._16_4_;
              local_248._20_4_ = local_2d8._20_4_;
              local_248._24_4_ = local_2d8._24_4_;
              local_248._28_4_ = local_2d8._28_4_;
              local_248._0_8_ = local_2d8._0_8_;
              local_248._8_4_ = local_2d8._8_4_;
              local_248._12_4_ = local_2d8._12_4_;
              local_220._path._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,local_2b0._M_p,local_2b0._M_p + local_2a8);
              local_198 = local_270._M_current;
              local_1a8 = local_280;
              uStack_1a4 = uStack_27c;
              uStack_1a0 = uStack_278;
              uStack_19c = uStack_274;
              uStack_1b0 = uStack_288;
              uStack_1ac = uStack_284;
              local_190[0] = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_190,local_268._M_p,local_268._M_p + local_260);
              local_200 = &local_1f8._path.field_2;
              iVar4 = 0;
              while( true ) {
                if ((char *)local_248._32_8_ == local_198) break;
                local_2f8 = local_2e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,".","");
                puVar10 = local_2f8;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)local_1d8,local_2f8,local_2f8 + local_2f0);
                fVar8 = (format)puVar10;
                if (local_2f8 != local_2e8) {
                  operator_delete(local_2f8);
                }
                postprocess_path_with_format((path *)local_1d8,fVar8);
                iVar5 = compare(&local_220,(path *)local_1d8);
                if (iVar5 == 0) {
                  bVar11 = false;
                  bVar12 = false;
                }
                else {
                  local_2f8 = local_2e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
                  local_1f8._path._M_dataplus._M_p = (pointer)&local_1f8._path.field_2;
                  puVar10 = local_2f8;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)&local_1f8,local_2f8,local_2f8 + local_2f0);
                  fVar8 = (format)puVar10;
                  if (local_2f8 != local_2e8) {
                    operator_delete(local_2f8);
                  }
                  postprocess_path_with_format(&local_1f8,fVar8);
                  iVar6 = compare(&local_220,&local_1f8);
                  if (iVar6 == 0) {
                    bVar11 = false;
                    bVar12 = false;
                  }
                  else {
                    local_2f8 = local_2e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"..","");
                    local_170._path._M_dataplus._M_p = (pointer)&local_170._path.field_2;
                    puVar10 = local_2f8;
                    std::__cxx11::string::
                    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              ((string *)&local_170,local_2f8,local_2f8 + local_2f0);
                    fVar8 = (format)puVar10;
                    if (local_2f8 != local_2e8) {
                      operator_delete(local_2f8);
                    }
                    postprocess_path_with_format(&local_170,fVar8);
                    iVar6 = compare(&local_220,&local_170);
                    bVar12 = iVar6 != 0;
                    bVar11 = true;
                  }
                }
                if ((bVar11) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._path._M_dataplus._M_p != &local_170._path.field_2)) {
                  operator_delete(local_170._path._M_dataplus._M_p);
                }
                if ((iVar5 != 0) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._path._M_dataplus._M_p != &local_1f8._path.field_2)) {
                  operator_delete(local_1f8._path._M_dataplus._M_p);
                }
                if (local_1d8[0] != local_1c8) {
                  operator_delete(local_1d8[0]);
                }
                iVar5 = 1;
                if (!bVar12) {
                  local_2f8 = local_2e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"..","");
                  puVar10 = local_2f8;
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)local_1d8,local_2f8,local_2f8 + local_2f0);
                  fVar8 = (format)puVar10;
                  if (local_2f8 != local_2e8) {
                    operator_delete(local_2f8);
                  }
                  postprocess_path_with_format((path *)local_1d8,fVar8);
                  iVar5 = compare(&local_220,(path *)local_1d8);
                  if (local_1d8[0] != local_1c8) {
                    operator_delete(local_1d8[0]);
                  }
                  iVar5 = -(uint)(iVar5 == 0);
                }
                iVar4 = iVar4 + iVar5;
                iterator::operator++((iterator *)local_248);
              }
              if (local_190[0] != local_180) {
                operator_delete(local_190[0]);
              }
              paVar1 = &local_220._path.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._path._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._path._M_dataplus._M_p);
              }
              if (local_268._M_p != local_258) {
                operator_delete(local_268._M_p);
              }
              if (local_2b0._M_p != local_2a0) {
                operator_delete(local_2b0._M_p);
              }
              (__return_storage_ptr__->_path)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->_path).field_2;
              (__return_storage_ptr__->_path)._M_string_length = 0;
              (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
              if (-1 < iVar4) {
                for (; iVar4 != 0; iVar4 = iVar4 + -1) {
                  append<char[3]>(__return_storage_ptr__,(char (*) [3])"..");
                }
                local_1b8._M_current =
                     (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
                iterator::iterator((iterator *)local_248,this,&local_1b8);
                input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                          ((input_iterator_range<ghc::filesystem::path::iterator> *)local_2d8,
                           &local_150,(iterator *)local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_220._path._M_dataplus._M_p);
                }
                local_248._32_8_ = local_2b8._M_current;
                local_248._16_4_ = local_2d8._16_4_;
                local_248._20_4_ = local_2d8._20_4_;
                local_248._24_4_ = local_2d8._24_4_;
                local_248._28_4_ = local_2d8._28_4_;
                local_248._0_8_ = local_2d8._0_8_;
                local_248._8_4_ = local_2d8._8_4_;
                local_248._12_4_ = local_2d8._12_4_;
                local_220._path._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,local_2b0._M_p,local_2b0._M_p + local_2a8);
                local_198 = local_270._M_current;
                local_1a8 = local_280;
                uStack_1a4 = uStack_27c;
                uStack_1a0 = uStack_278;
                uStack_19c = uStack_274;
                uStack_1b0 = uStack_288;
                uStack_1ac = uStack_284;
                local_190[0] = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_190,local_268._M_p,local_268._M_p + local_260);
                while ((char *)local_248._32_8_ != local_198) {
                  operator/=(__return_storage_ptr__,&local_220);
                  iterator::operator++((iterator *)local_248);
                }
                if (local_190[0] != local_180) {
                  operator_delete(local_190[0]);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_220._path._M_dataplus._M_p);
                }
                if (local_268._M_p != local_258) {
                  operator_delete(local_268._M_p);
                }
                if (local_2b0._M_p != local_2a0) {
                  operator_delete(local_2b0._M_p);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._current._path._M_dataplus._M_p != &local_108._current._path.field_2) {
              operator_delete(local_108._current._path._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._current._path._M_dataplus._M_p == &local_150._current._path.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_150._current._path._M_dataplus._M_p);
            return __return_storage_ptr__;
          }
          iterator::operator++(&local_150);
          iterator::operator++(&local_108);
        } while( true );
      }
      sVar7 = root_name_length(base);
      if (sVar7 < (base->_path)._M_string_length) {
        bVar11 = (base->_path)._M_dataplus._M_p[sVar7] == '/';
      }
      else {
        bVar11 = false;
      }
      if ((const_iterator *)local_150._first._M_current != &local_150._prefix) {
        operator_delete(local_150._first._M_current);
      }
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_);
      }
      if (!bVar11) goto LAB_001ade1d;
      goto LAB_001add61;
    }
  }
  if ((const_iterator *)local_150._first._M_current != &local_150._prefix) {
    operator_delete(local_150._first._M_current);
  }
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_);
  }
LAB_001add61:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}